

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_CurveProxyHistory * __thiscall
ON_ClassArray<ON_CurveProxyHistory>::SetCapacity
          (ON_ClassArray<ON_CurveProxyHistory> *this,size_t new_capacity)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ON_CurveProxyHistory *pOVar2;
  
  uVar5 = this->m_capacity;
  uVar6 = (ulong)uVar5;
  if (uVar6 == 0) {
    this->m_a = (ON_CurveProxyHistory *)0x0;
    this->m_count = 0;
  }
  uVar4 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar4 = 0;
  }
  if ((int)uVar4 < 1) {
    pOVar2 = this->m_a;
    if (pOVar2 != (ON_CurveProxyHistory *)0x0) {
      if (0 < (int)uVar5) {
        uVar8 = uVar6 + 1;
        lVar3 = uVar6 * 0x158;
        do {
          ON_CurveProxyHistory::~ON_CurveProxyHistory
                    ((ON_CurveProxyHistory *)(this->m_a[-1].m_curve_ref.m_uuid.Data4 + lVar3 + -8));
          uVar8 = uVar8 - 1;
          lVar3 = lVar3 + -0x158;
        } while (1 < uVar8);
        pOVar2 = this->m_a;
      }
      (*this->_vptr_ON_ClassArray[4])(this,pOVar2,0);
      this->m_a = (ON_CurveProxyHistory *)0x0;
    }
  }
  else if ((int)uVar5 < (int)uVar4) {
    iVar1 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar4);
    pOVar2 = (ON_CurveProxyHistory *)CONCAT44(extraout_var,iVar1);
    this->m_a = pOVar2;
    if (pOVar2 != (ON_CurveProxyHistory *)0x0) {
      memset(pOVar2 + this->m_capacity,0,((long)(int)uVar4 - (long)this->m_capacity) * 0x158);
      iVar1 = this->m_capacity;
      if (iVar1 < (int)uVar4) {
        lVar3 = (long)iVar1 * 0x158;
        lVar7 = (ulong)uVar4 - (long)iVar1;
        do {
          ON_CurveProxyHistory::ON_CurveProxyHistory
                    ((ON_CurveProxyHistory *)((this->m_a->m_curve_ref).m_uuid.Data4 + lVar3 + -8));
          lVar3 = lVar3 + 0x158;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      this->m_capacity = uVar4;
      goto LAB_0055ba4f;
    }
  }
  else {
    if (uVar5 <= uVar4) goto LAB_0055ba4f;
    do {
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
      ON_CurveProxyHistory::~ON_CurveProxyHistory(this->m_a + uVar6);
    } while ((int)uVar4 < (int)uVar5);
    if ((int)uVar4 < this->m_count) {
      this->m_count = uVar4;
    }
    this->m_capacity = uVar4;
    iVar1 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar4);
    this->m_a = (ON_CurveProxyHistory *)CONCAT44(extraout_var_00,iVar1);
    if ((ON_CurveProxyHistory *)CONCAT44(extraout_var_00,iVar1) != (ON_CurveProxyHistory *)0x0)
    goto LAB_0055ba4f;
  }
  this->m_count = 0;
  this->m_capacity = 0;
LAB_0055ba4f:
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}